

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DynamicMessageTest_PackedFields_Test::TestBody
          (DynamicMessageTest_PackedFields_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  Arena *local_170;
  undefined1 local_150 [8];
  ReflectionTester reflection_tester;
  Message *message;
  Arena arena;
  DynamicMessageTest_PackedFields_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&message);
  pMVar2 = (this->super_DynamicMessageTest).packed_prototype_;
  bVar1 = DynamicMessageTest::use_arena(&this->super_DynamicMessageTest);
  if (bVar1) {
    local_170 = (Arena *)&message;
  }
  else {
    local_170 = (Arena *)0x0;
  }
  pMVar2 = Message::New(pMVar2,local_170);
  TestUtil::ReflectionTester::ReflectionTester
            ((ReflectionTester *)local_150,(this->super_DynamicMessageTest).packed_descriptor_);
  TestUtil::ReflectionTester::SetPackedFieldsViaReflection((ReflectionTester *)local_150,pMVar2);
  TestUtil::ReflectionTester::ExpectPackedFieldsSetViaReflection
            ((ReflectionTester *)local_150,pMVar2);
  bVar1 = DynamicMessageTest::use_arena(&this->super_DynamicMessageTest);
  if ((!bVar1) && (pMVar2 != (Message *)0x0)) {
    (*(pMVar2->super_MessageLite)._vptr_MessageLite[1])();
  }
  Arena::~Arena((Arena *)&message);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, PackedFields) {
  // Check that packed fields work properly.
  Arena arena;
  Message* message = packed_prototype_->New(use_arena() ? &arena : nullptr);
  TestUtil::ReflectionTester reflection_tester(packed_descriptor_);

  reflection_tester.SetPackedFieldsViaReflection(message);
  reflection_tester.ExpectPackedFieldsSetViaReflection(*message);

  if (!use_arena()) {
    delete message;
  }
}